

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall glu::sl::ShaderParser::advanceToken(ShaderParser *this)

{
  string *this_00;
  byte bVar1;
  char *pcVar2;
  size_t __n;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  byte *pbVar6;
  SimpleToken *pSVar7;
  ulong uVar8;
  byte *__s2;
  long lVar9;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->m_curTokenStr;
  pcVar2 = (char *)(this->m_curTokenStr)._M_string_length;
  this->m_curPtr = this->m_curPtr + (long)pcVar2;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar2,0xaf21f7);
  __s2 = (byte *)this->m_curPtr;
  while( true ) {
    bVar1 = *__s2;
    uVar8 = (ulong)bVar1;
    if (0x23 < uVar8) break;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 != 0x23) {
        if (uVar8 == 0) {
          this->m_curToken = TOKEN_EOF;
          std::__cxx11::string::_M_replace
                    ((ulong)this_00,0,(char *)(this->m_curTokenStr)._M_string_length,0xbb7f3c);
          return;
        }
        break;
      }
      while ((0xd < *__s2 || ((0x2401U >> (*__s2 & 0x1f) & 1) == 0))) {
        __s2 = __s2 + 1;
        this->m_curPtr = (char *)__s2;
      }
    }
    else {
      __s2 = __s2 + 1;
      this->m_curPtr = (char *)__s2;
    }
  }
  pbVar4 = __s2;
  if (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)) {
    do {
      do {
        pbVar4 = pbVar4 + 1;
        bVar1 = *pbVar4;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar1 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)
             )));
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    this->m_curToken = TOKEN_IDENTIFIER;
    lVar9 = 8;
    do {
      iVar3 = std::__cxx11::string::compare((char *)this_00);
      if (iVar3 == 0) {
        this->m_curToken = *(Token *)((long)&advanceToken::s_named[0].str + lVar9);
        return;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x308);
    return;
  }
  if (0xf5 < (byte)(bVar1 - 0x3a)) {
    do {
      pbVar6 = pbVar4;
      pbVar4 = pbVar6 + 1;
    } while (0xf5 < (byte)(*pbVar6 - 0x3a));
    if (*pbVar6 == 0x2e) {
      do {
        pbVar6 = pbVar4;
        pbVar4 = pbVar6 + 1;
      } while (0xf5 < (byte)(*pbVar6 - 0x3a));
      if ((*pbVar6 | 0x20) == 0x65) {
        if ((*pbVar4 == 0x2b) || (*pbVar4 == 0x2d)) {
          pbVar4 = pbVar6 + 2;
        }
        pbVar6 = pbVar4 + -1;
        do {
          pbVar4 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
        } while (0xf5 < (byte)(*pbVar4 - 0x3a));
      }
      this->m_curToken = TOKEN_FLOAT_LITERAL;
    }
    else {
      this->m_curToken = TOKEN_INT_LITERAL;
    }
    goto LAB_00a5a580;
  }
  if (bVar1 == 0x22) {
    if (__s2[1] != 0x22) goto LAB_00a5a304;
    for (pbVar4 = __s2 + 2; (*pbVar4 != 0x22 || (pbVar4[1] != 0x22));
        pbVar4 = pbVar4 + (ulong)(*pbVar4 == 0x5c) + 1) {
    }
    this->m_curToken = TOKEN_SHADER_SOURCE;
    iVar3 = ((int)pbVar4 - (int)__s2) + 2;
  }
  else {
    if (bVar1 != 0x27) {
      if (*__s2 == 0x3d) {
        this->m_curToken = TOKEN_ASSIGN;
        std::__cxx11::string::operator=((string *)this_00,"=");
        return;
      }
      uVar8 = 0xffffffffffffffff;
      pSVar7 = advanceToken::s_simple;
      do {
        pSVar7 = pSVar7 + 1;
        if (uVar8 == 0xb) goto LAB_00a5a531;
        pcVar2 = pSVar7->str;
        __n = strlen(pcVar2);
        iVar3 = strncmp(pcVar2,(char *)__s2,__n);
        uVar8 = uVar8 + 1;
      } while (iVar3 != 0);
      this->m_curToken = pSVar7->token;
      std::__cxx11::string::operator=((string *)this_00,pcVar2);
      if (uVar8 < 0xc) {
        return;
      }
LAB_00a5a531:
      this->m_curToken = TOKEN_INVALID;
      std::__cxx11::string::_M_replace_aux
                ((ulong)this_00,0,(this->m_curTokenStr)._M_string_length,'\x01');
      return;
    }
LAB_00a5a304:
    pbVar4 = __s2 + 1;
    bVar5 = __s2[1];
    while (bVar5 != bVar1) {
      pbVar4 = pbVar4 + (ulong)(bVar5 == 0x5c) + 1;
      bVar5 = *pbVar4;
    }
    this->m_curToken = TOKEN_STRING;
    iVar3 = ((int)pbVar4 - (int)__s2) + 1;
  }
  pbVar6 = __s2 + iVar3;
LAB_00a5a580:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2,pbVar6);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void ShaderParser::advanceToken (void)
{
	// Skip old token.
	m_curPtr += m_curTokenStr.length();

	// Reset token (for safety).
	m_curToken		= TOKEN_INVALID;
	m_curTokenStr	= "";

	// Eat whitespace & comments while they last.
	for (;;)
	{
		while (isWhitespace(*m_curPtr))
			m_curPtr++;

		// Check for EOL comment.
		if (*m_curPtr == '#')
		{
			while (*m_curPtr && !isEOL(*m_curPtr))
				m_curPtr++;
		}
		else
			break;
	}

	if (!*m_curPtr)
	{
		m_curToken = TOKEN_EOF;
		m_curTokenStr = "<EOF>";
	}
	else if (isAlpha(*m_curPtr))
	{
		struct Named
		{
			const char*		str;
			Token			token;
		};

		static const Named s_named[] =
		{
			{ "true",						TOKEN_TRUE						},
			{ "false",						TOKEN_FALSE						},
			{ "desc",						TOKEN_DESC						},
			{ "expect",						TOKEN_EXPECT					},
			{ "group",						TOKEN_GROUP						},
			{ "case",						TOKEN_CASE						},
			{ "end",						TOKEN_END						},
			{ "values",						TOKEN_VALUES					},
			{ "both",						TOKEN_BOTH						},
			{ "vertex",						TOKEN_VERTEX					},
			{ "fragment",					TOKEN_FRAGMENT					},
			{ "uniform",					TOKEN_UNIFORM					},
			{ "input",						TOKEN_INPUT						},
			{ "output",						TOKEN_OUTPUT					},
			{ "float",						TOKEN_FLOAT						},
			{ "vec2",						TOKEN_FLOAT_VEC2				},
			{ "vec3",						TOKEN_FLOAT_VEC3				},
			{ "vec4",						TOKEN_FLOAT_VEC4				},
			{ "mat2",						TOKEN_FLOAT_MAT2				},
			{ "mat2x3",						TOKEN_FLOAT_MAT2X3				},
			{ "mat2x4",						TOKEN_FLOAT_MAT2X4				},
			{ "mat3x2",						TOKEN_FLOAT_MAT3X2				},
			{ "mat3",						TOKEN_FLOAT_MAT3				},
			{ "mat3x4",						TOKEN_FLOAT_MAT3X4				},
			{ "mat4x2",						TOKEN_FLOAT_MAT4X2				},
			{ "mat4x3",						TOKEN_FLOAT_MAT4X3				},
			{ "mat4",						TOKEN_FLOAT_MAT4				},
			{ "int",						TOKEN_INT						},
			{ "ivec2",						TOKEN_INT_VEC2					},
			{ "ivec3",						TOKEN_INT_VEC3					},
			{ "ivec4",						TOKEN_INT_VEC4					},
			{ "uint",						TOKEN_UINT						},
			{ "uvec2",						TOKEN_UINT_VEC2					},
			{ "uvec3",						TOKEN_UINT_VEC3					},
			{ "uvec4",						TOKEN_UINT_VEC4					},
			{ "bool",						TOKEN_BOOL						},
			{ "bvec2",						TOKEN_BOOL_VEC2					},
			{ "bvec3",						TOKEN_BOOL_VEC3					},
			{ "bvec4",						TOKEN_BOOL_VEC4					},
			{ "version",					TOKEN_VERSION					},
			{ "tessellation_control",		TOKEN_TESSELLATION_CONTROL		},
			{ "tessellation_evaluation",	TOKEN_TESSELLATION_EVALUATION	},
			{ "geometry",					TOKEN_GEOMETRY					},
			{ "require",					TOKEN_REQUIRE					},
			{ "in",							TOKEN_IN						},
			{ "import",						TOKEN_IMPORT					},
			{ "pipeline_program",			TOKEN_PIPELINE_PROGRAM			},
			{ "active_stages",				TOKEN_ACTIVE_STAGES				},
		};

		const char* end = m_curPtr + 1;
		while (isCaseNameChar(*end))
			end++;
		m_curTokenStr = string(m_curPtr, end - m_curPtr);

		m_curToken = TOKEN_IDENTIFIER;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_named); ndx++)
		{
			if (m_curTokenStr == s_named[ndx].str)
			{
				m_curToken = s_named[ndx].token;
				break;
			}
		}
	}
	else if (isNumeric(*m_curPtr))
	{
		/* \todo [2010-03-31 petri] Hex? */
		const char* p = m_curPtr;
		while (isNumeric(*p))
			p++;
		if (*p == '.')
		{
			p++;
			while (isNumeric(*p))
				p++;

			if (*p == 'e' || *p == 'E')
			{
				p++;
				if (*p == '+' || *p == '-')
					p++;
				DE_ASSERT(isNumeric(*p));
				while (isNumeric(*p))
					p++;
			}

			m_curToken = TOKEN_FLOAT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
		else
		{
			m_curToken = TOKEN_INT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
	}
	else if (*m_curPtr == '"' && m_curPtr[1] == '"')
	{
		const char*	p = m_curPtr + 2;

		while ((p[0] != '"') || (p[1] != '"'))
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p += 2;

		m_curToken		= TOKEN_SHADER_SOURCE;
		m_curTokenStr	= string(m_curPtr, (int)(p - m_curPtr));
	}
	else if (*m_curPtr == '"' || *m_curPtr == '\'')
	{
		char		endChar = *m_curPtr;
		const char*	p		= m_curPtr + 1;

		while (*p != endChar)
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p++;

		m_curToken		= TOKEN_STRING;
		m_curTokenStr	= string(m_curPtr, (int)(p - m_curPtr));
	}
	else
	{
		struct SimpleToken
		{
			const char*		str;
			Token			token;
		};

		static const SimpleToken s_simple[] =
		{
			{ "=",			TOKEN_ASSIGN		},
			{ "+",			TOKEN_PLUS			},
			{ "-",			TOKEN_MINUS			},
			{ ",",			TOKEN_COMMA			},
			{ "|",			TOKEN_VERTICAL_BAR	},
			{ ";",			TOKEN_SEMI_COLON	},
			{ "(",			TOKEN_LEFT_PAREN	},
			{ ")",			TOKEN_RIGHT_PAREN	},
			{ "[",			TOKEN_LEFT_BRACKET	},
			{ "]",			TOKEN_RIGHT_BRACKET },
			{ "{",			TOKEN_LEFT_BRACE	},
			{ "}",			TOKEN_RIGHT_BRACE	},
			{ ">",			TOKEN_GREATER		},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_simple); ndx++)
		{
			if (strncmp(s_simple[ndx].str, m_curPtr, strlen(s_simple[ndx].str)) == 0)
			{
				m_curToken		= s_simple[ndx].token;
				m_curTokenStr	= s_simple[ndx].str;
				return;
			}
		}

		// Otherwise invalid token.
		m_curToken = TOKEN_INVALID;
		m_curTokenStr = *m_curPtr;
	}
}